

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O3

int re_parse_alternative(REParseState *s,BOOL is_backward_dir)

{
  uint8_t **ppuVar1;
  REParseState *s_00;
  anon_union_128_2_3affbfe2_for_u *data;
  size_t sVar2;
  byte bVar3;
  uint uVar4;
  uint32_t uVar5;
  int iVar6;
  int iVar7;
  BOOL BVar8;
  uint uVar9;
  sbyte sVar10;
  uint8_t *p_1;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  uint8_t *p_2;
  size_t sVar14;
  byte *pbVar15;
  undefined8 uVar16;
  byte bVar17;
  int iVar18;
  uint8_t *puVar19;
  ulong uVar20;
  uint8_t uVar21;
  int iVar22;
  int iVar23;
  uint8_t *puVar24;
  char *pcVar25;
  byte *pbVar26;
  ulong uVar27;
  ulong uVar28;
  size_t sVar29;
  int iVar30;
  uint8_t *p;
  byte *pbVar31;
  int iVar32;
  CharRange cr_s_1;
  CharRange cr1_s;
  CharRange a;
  CharRange cr_s;
  byte *local_218;
  REParseState *local_210;
  uint8_t local_201;
  uint8_t *local_200;
  ulong local_1f8;
  size_t local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  byte *local_1d8;
  byte *local_1d0;
  int local_1c8;
  int local_1c4;
  CharRange local_1c0;
  ulong local_1a0;
  anon_union_128_2_3affbfe2_for_u *local_198;
  int *local_190;
  DynBuf *local_188;
  size_t local_180;
  CharRange local_178;
  CharRange local_158 [8];
  CharRange local_50;
  
  pbVar26 = s->buf_ptr;
  if (s->buf_end <= pbVar26) {
    return 0;
  }
  puVar19 = (uint8_t *)(ulong)(uint)is_backward_dir;
  local_180 = (s->byte_code).size;
  local_190 = &s->has_named_captures;
  local_198 = &s->u;
  local_188 = &s->group_names;
  local_1c8 = is_backward_dir + 0x13;
  local_201 = '\f' - (char)is_backward_dir;
  local_1c4 = is_backward_dir + 0xb;
  local_210 = s;
  local_200 = puVar19;
LAB_0016ee8b:
  data = local_198;
  bVar17 = *pbVar26;
  if (bVar17 == 0x29) {
    return 0;
  }
  if (bVar17 == 0x7c) {
    return 0;
  }
  local_1e0 = (s->byte_code).size;
  iVar7 = (int)puVar19;
  local_218 = pbVar26;
  if (bVar17 < 0x5b) {
    switch(bVar17) {
    case 0x24:
      uVar21 = '\x06';
      goto LAB_0016f42a;
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x29:
    case 0x2c:
    case 0x2d:
      break;
    case 0x28:
      if (pbVar26[1] == 0x3f) {
        bVar17 = pbVar26[2];
        uVar9 = (uint)bVar17;
        if (bVar17 < 0x3c) {
          if (uVar9 != 0x21) {
            if (uVar9 != 0x3a) {
LAB_0017027b:
              pcVar25 = "invalid group";
              goto LAB_001701c8;
            }
            uVar9 = s->capture_count;
            s->buf_ptr = pbVar26 + 3;
            iVar7 = re_parse_disjunction(s,iVar7);
            if (iVar7 != 0) {
              return -1;
            }
            ppuVar1 = &s->buf_ptr;
            s = local_210;
            if (**ppuVar1 != ')') goto LAB_0017025c;
            local_218 = *ppuVar1 + 1;
            uVar27 = local_1e0 & 0xffffffff;
            local_1f8 = (ulong)uVar9;
            goto LAB_0016f603;
          }
LAB_0016f9c5:
          pbVar26 = pbVar26 + 3;
          BVar8 = 0;
          if (s->is_utf16 == 0) {
            local_1f8 = (ulong)(uint)s->capture_count;
            uVar27 = local_1e0 & 0xffffffff;
          }
          else {
            uVar27 = 0xffffffff;
            local_1f8 = 0;
          }
        }
        else {
          if (bVar17 != 0x3c) {
            if (uVar9 != 0x3d) goto LAB_0017027b;
            goto LAB_0016f9c5;
          }
          bVar17 = pbVar26[3];
          if ((bVar17 != 0x3d) && (bVar17 != 0x21)) {
            local_218 = pbVar26 + 3;
            iVar6 = re_parse_group_name(local_198->error_msg,(int)&local_218,
                                        (uint8_t **)(ulong)(uint)s->is_utf16,uVar9);
            if (iVar6 != 0) {
LAB_00170287:
              pcVar25 = "invalid group name";
              goto LAB_001701c8;
            }
            iVar6 = find_group_name((REParseState *)(s->group_names).buf,
                                    (char *)(s->group_names).size);
            if (0 < iVar6) {
              pcVar25 = "duplicate group name";
              goto LAB_001701c8;
            }
            sVar29 = strlen(data->error_msg);
            dbuf_put(local_188,(uint8_t *)data->error_msg,sVar29 + 1);
            *local_190 = 1;
            goto LAB_0016f4c0;
          }
          pbVar26 = pbVar26 + 4;
          uVar27 = 0xffffffff;
          local_1f8 = 0;
          BVar8 = 1;
        }
        dbuf_putc(&s->byte_code,(bVar17 == 0x21) + '\x17');
        sVar14 = (s->byte_code).size;
        local_158[0]._0_8_ = local_158[0]._0_8_ & 0xffffffff00000000;
        dbuf_put(&s->byte_code,(uint8_t *)local_158,4);
        s->buf_ptr = pbVar26;
        iVar7 = re_parse_disjunction(s,BVar8);
        if (iVar7 != 0) {
          return -1;
        }
        if (*s->buf_ptr == ')') {
          local_218 = s->buf_ptr + 1;
          dbuf_putc(&s->byte_code,'\n');
          if ((s->byte_code).error != 0) {
            return -1;
          }
          iVar7 = (int)sVar14;
          *(int *)((s->byte_code).buf + iVar7) = ((int)(s->byte_code).size - iVar7) + -4;
          goto LAB_0016f603;
        }
      }
      else {
        local_218 = pbVar26 + 1;
        dbuf_putc(local_188,'\0');
LAB_0016f4c0:
        uVar9 = s->capture_count;
        if (0xfe < (int)uVar9) {
          pcVar25 = "too many captures";
          goto LAB_001701c8;
        }
        local_1f0 = (s->byte_code).size;
        s->capture_count = uVar9 + 1;
        dbuf_putc(&s->byte_code,(uint8_t)local_1c4);
        dbuf_putc(&s->byte_code,(uint8_t)uVar9);
        s->buf_ptr = local_218;
        iVar7 = re_parse_disjunction(s,iVar7);
        if (iVar7 != 0) {
          return -1;
        }
        puVar24 = s->buf_ptr;
        dbuf_putc(&s->byte_code,local_201);
        dbuf_putc(&s->byte_code,(uint8_t)uVar9);
        s = local_210;
        if (*puVar24 == ')') {
          local_218 = puVar24 + 1;
          uVar27 = local_1f0;
          local_1f8 = (ulong)uVar9;
          goto LAB_0016f603;
        }
      }
LAB_0017025c:
      uVar16 = 0x29;
      goto LAB_00170261;
    case 0x2a:
    case 0x2b:
switchD_0016f16b_caseD_2a:
      pcVar25 = "nothing to repeat";
      goto LAB_001701c8;
    case 0x2e:
      local_218 = pbVar26 + 1;
      local_1f8 = (ulong)(uint)s->capture_count;
      if (iVar7 == 0) {
        uVar21 = '\x04' - (s->dotall == 0);
      }
      else {
        dbuf_putc(&s->byte_code,'\x1b');
        dbuf_putc(&s->byte_code,'\x04' - (s->dotall == 0));
LAB_0016f2dc:
        uVar21 = '\x1b';
      }
      dbuf_putc(&s->byte_code,uVar21);
LAB_0016f5fb:
      uVar27 = local_1e0 & 0xffffffff;
      goto LAB_0016f603;
    default:
      if (bVar17 == 0x3f) goto switchD_0016f16b_caseD_2a;
    }
    goto switchD_0016f16b_caseD_25;
  }
  switch(bVar17) {
  case 0x5b:
    local_1f8 = (ulong)(uint)s->capture_count;
    if (iVar7 != 0) {
      dbuf_putc(&s->byte_code,'\x1b');
    }
    cr_init(&local_1c0,s->opaque,lre_realloc);
    pbVar31 = pbVar26 + 1;
    bVar17 = pbVar26[1];
    bVar3 = bVar17;
    if (bVar17 == 0x5e) {
      pbVar31 = pbVar26 + 2;
      bVar3 = pbVar26[2];
    }
    local_1d8 = pbVar31;
    while (bVar3 != 0x5d) {
      uVar9 = get_class_atom(s,&local_178,&local_1d8,1);
      pbVar31 = local_1d8;
      if ((int)uVar9 < 0) goto LAB_00170231;
      if ((*local_1d8 == 0x2d) && (local_1d8[1] != 0x5d)) {
        local_1d0 = local_1d8 + 1;
        if (0x3fffffff < uVar9) {
          if (s->is_utf16 != 0) {
            cr_free(&local_178);
            goto LAB_001701ef;
          }
          goto LAB_0016f0bb;
        }
        uVar4 = get_class_atom(s,&local_178,&local_1d0,1);
        if ((int)uVar4 < 0) goto LAB_00170231;
        if (0x3fffffff < uVar4) {
          cr_free(&local_178);
          if (s->is_utf16 == 0) goto LAB_0016f0bb;
LAB_001701ef:
          pcVar25 = "invalid class range";
          goto LAB_00170227;
        }
        local_1d8 = local_1d0;
        pbVar31 = local_1d0;
        if (uVar4 < uVar9) goto LAB_001701ef;
LAB_0016f104:
        local_158[0].size = uVar4 + 1;
        local_158[0].len = uVar9;
        iVar7 = cr_union1(&local_1c0,(uint32_t *)local_158,2);
      }
      else {
LAB_0016f0bb:
        uVar4 = uVar9;
        if (uVar9 < 0x40000000) goto LAB_0016f104;
        iVar7 = cr_union1(&local_1c0,local_178.points,local_178.len);
        cr_free(&local_178);
      }
      if (iVar7 != 0) goto LAB_00170220;
      bVar3 = *pbVar31;
    }
    if (s->ignore_case == 0) {
LAB_0016efd5:
      if ((bVar17 != 0x5e) || (iVar7 = cr_invert(&local_1c0), iVar7 == 0)) {
        iVar7 = re_emit_range(s,&local_1c0);
        if (iVar7 != 0) goto LAB_00170231;
        cr_free(&local_1c0);
        local_218 = pbVar31 + 1;
        puVar19 = local_200;
        if ((int)local_200 != 0) goto LAB_0016f2dc;
        goto LAB_0016f5fb;
      }
    }
    else {
      cr_init(local_158,local_1c0.mem_opaque,lre_realloc);
      local_1d0 = (byte *)0x7b00000061;
      iVar7 = cr_op(local_158,local_1c0.points,local_1c0.len,(uint32_t *)&local_1d0,2,1);
      if (iVar7 == 0) {
        if (0 < local_158[0].len) {
          lVar11 = 0;
          do {
            local_158[0].points[lVar11] = local_158[0].points[lVar11] - 0x20;
            lVar11 = lVar11 + 1;
          } while (lVar11 < local_158[0].len);
        }
        iVar7 = cr_union1(&local_1c0,local_158[0].points,local_158[0].len);
        cr_free(local_158);
        if (iVar7 == 0) goto LAB_0016efd5;
      }
      else {
        cr_free(local_158);
      }
    }
LAB_00170220:
    pcVar25 = "out of memory";
LAB_00170227:
    re_parse_error(s,pcVar25);
LAB_00170231:
    cr_free(&local_1c0);
    return -1;
  case 0x5c:
    bVar17 = pbVar26[1];
    if (0x41 < bVar17) {
      if (bVar17 != 0x42) {
        if (bVar17 == 0x6b) {
          if (pbVar26[2] == 0x3c) {
            local_158[0]._0_8_ = pbVar26 + 3;
            iVar6 = re_parse_group_name(local_198->error_msg,(int)local_158,
                                        (uint8_t **)(ulong)(uint)s->is_utf16,0x6b);
            if (iVar6 == 0) {
              uVar9 = find_group_name((REParseState *)(s->group_names).buf,
                                      (char *)(s->group_names).size);
              if ((-1 < (int)uVar9) ||
                 (uVar9 = re_parse_captures(s,&local_1c0.len,data->error_msg), -1 < (int)uVar9)) {
                uVar27 = (ulong)uVar9;
                local_218 = (byte *)local_158[0]._0_8_;
                goto LAB_0016f3ee;
              }
              if ((s->is_utf16 != 0) || (BVar8 = re_has_named_captures(s), BVar8 != 0)) {
                pcVar25 = "group name not defined";
                goto LAB_001701c8;
              }
            }
            else if ((s->is_utf16 != 0) || (BVar8 = re_has_named_captures(s), BVar8 != 0))
            goto LAB_00170287;
          }
          else {
            local_158[0]._0_8_ = pbVar26;
            if ((s->is_utf16 != 0) || (BVar8 = re_has_named_captures(s), BVar8 != 0)) {
              pcVar25 = "expecting group name";
              goto LAB_001701c8;
            }
          }
        }
        else if (bVar17 == 0x62) goto LAB_0016fa01;
        break;
      }
LAB_0016fa01:
      dbuf_putc(&s->byte_code,(bVar17 != 0x62) + '\x11');
      pbVar26 = pbVar26 + 2;
      pbVar31 = pbVar26;
      goto LAB_0016fe9e;
    }
    if (bVar17 - 0x31 < 9) {
      pbVar31 = pbVar26 + 1;
      uVar27 = 0;
      local_218 = pbVar31;
      do {
        uVar27 = ((ulong)bVar17 + uVar27 * 10) - 0x30;
        pbVar15 = pbVar31;
        if (0x7ffffffe < uVar27) goto LAB_0016f559;
        bVar17 = local_218[1];
        local_218 = local_218 + 1;
      } while (0xf5 < (byte)(bVar17 - 0x3a));
      if (s->capture_count <= (int)uVar27) {
        iVar6 = s->total_capture_count;
        if (iVar6 < 0) {
          iVar6 = re_parse_captures(s,local_190,(char *)0x0);
          s->total_capture_count = iVar6;
        }
        pbVar15 = local_218;
        if (iVar6 <= (int)uVar27) {
LAB_0016f559:
          local_218 = pbVar15;
          if (s->is_utf16 != 0) {
            pcVar25 = "back reference out of range in regular expression";
            goto LAB_001701c8;
          }
          bVar17 = *pbVar31;
          uVar5 = (uint32_t)bVar17;
          if (bVar17 < 0x38) {
            uVar5 = 0;
            if (bVar17 < 0x34) {
              pbVar31 = pbVar26 + 2;
              uVar5 = bVar17 - 0x30;
              bVar17 = pbVar26[2];
            }
            s = local_210;
            local_218 = pbVar31;
            if ((bVar17 & 0xf8) == 0x30) {
              uVar5 = ((uint)bVar17 + uVar5 * 8) - 0x30;
              local_218 = pbVar31 + 1;
              if ((pbVar31[1] & 0xf8) == 0x30) {
                uVar5 = ((uint)pbVar31[1] + uVar5 * 8) - 0x30;
                local_218 = pbVar31 + 2;
              }
            }
          }
          else {
            local_218 = pbVar26 + 2;
          }
          goto LAB_0016f1c7;
        }
      }
LAB_0016f3ee:
      sVar14 = (s->byte_code).size;
      local_1f8 = (ulong)(uint)s->capture_count;
      dbuf_putc(&s->byte_code,(uint8_t)local_1c8);
      dbuf_putc(&s->byte_code,(uint8_t)uVar27);
      uVar27 = (ulong)(uint)sVar14;
      goto LAB_0016f603;
    }
    if (bVar17 != 0x30) break;
    local_218 = pbVar26 + 2;
    bVar17 = pbVar26[2];
    if (s->is_utf16 == 0) {
      s = local_210;
      if ((bVar17 & 0xf8) == 0x30) {
        uVar5 = bVar17 - 0x30;
        local_218 = pbVar26 + 3;
        if ((pbVar26[3] & 0xf8) == 0x30) {
          uVar5 = ((uint)pbVar26[3] + uVar5 * 8) - 0x30;
          local_218 = pbVar26 + 4;
        }
      }
      else {
        uVar5 = 0;
      }
    }
    else {
      if (0xfffffff5 < bVar17 - 0x3a) {
        pcVar25 = "invalid decimal escape in regular expression";
        goto LAB_001701c8;
      }
      uVar5 = 0;
    }
    goto LAB_0016f1c7;
  case 0x5d:
switchD_0016eed2_caseD_5d:
    if (s->is_utf16 != 0) {
LAB_001701c1:
      pcVar25 = "syntax error";
      goto LAB_001701c8;
    }
    break;
  case 0x5e:
    uVar21 = '\x05';
LAB_0016f42a:
    pbVar26 = pbVar26 + 1;
    local_218 = pbVar26;
    dbuf_putc(&s->byte_code,uVar21);
    pbVar31 = local_218;
    goto LAB_0016fe9e;
  default:
    if (bVar17 == 0x7b) {
      if (s->is_utf16 != 0) goto LAB_001701c1;
      bVar17 = pbVar26[1];
      if (0xfffffff5 < bVar17 - 0x3a) {
        while (0xf5 < (byte)(bVar17 - 0x3a)) {
          bVar17 = pbVar26[2];
          pbVar26 = pbVar26 + 1;
        }
        if ((bVar17 == 0x2c) &&
           (bVar17 = pbVar26[2], 0xf5 < (byte)(bVar17 - 0x3a) && 0xfffffff5 < bVar17 - 0x3a)) {
          pbVar26 = pbVar26 + 3;
          do {
            bVar17 = *pbVar26;
            pbVar26 = pbVar26 + 1;
          } while (0xf5 < (byte)(bVar17 - 0x3a));
        }
        if (bVar17 == 0x7d) goto switchD_0016f16b_caseD_2a;
      }
    }
    else if (bVar17 == 0x7d) goto switchD_0016eed2_caseD_5d;
  }
switchD_0016f16b_caseD_25:
  uVar5 = get_class_atom(s,&local_50,&local_218,0);
  if ((int)uVar5 < 0) {
    return -1;
  }
LAB_0016f1c7:
  uVar27 = (ulong)(uint)(s->byte_code).size;
  uVar9 = s->capture_count;
  if (iVar7 != 0) {
    dbuf_putc(&s->byte_code,'\x1b');
  }
  if ((int)uVar5 < 0x40000000) {
    if (local_210->ignore_case != 0) {
      uVar5 = lre_canonicalize(uVar5,local_210->is_utf16);
    }
    s_00 = local_210;
    if ((int)uVar5 < 0x10000) {
      dbuf_putc(&local_210->byte_code,'\x01');
      local_158[0].len._0_2_ = (short)uVar5;
      sVar14 = 2;
    }
    else {
      dbuf_putc(&local_210->byte_code,'\x02');
      local_158[0].len = uVar5;
      sVar14 = 4;
    }
    dbuf_put(&s_00->byte_code,(uint8_t *)local_158,sVar14);
  }
  else {
    iVar6 = re_emit_range(local_210,&local_50);
    cr_free(&local_50);
    if (iVar6 != 0) {
      return -1;
    }
  }
  local_1f8 = (ulong)uVar9;
  if (iVar7 != 0) {
    dbuf_putc(&local_210->byte_code,'\x1b');
  }
LAB_0016f603:
  s = local_210;
  pbVar26 = local_218;
  iVar7 = (int)uVar27;
  pbVar31 = pbVar26;
  if (-1 < iVar7) {
    bVar17 = *local_218;
    if (bVar17 < 0x3f) {
      if (bVar17 == 0x2a) {
        iVar6 = 0;
      }
      else {
        if (bVar17 != 0x2b) goto LAB_0016fe9e;
        iVar6 = 1;
      }
      local_218 = local_218 + 1;
      iVar32 = 0x7fffffff;
    }
    else {
      if (bVar17 != 0x3f) {
        if (bVar17 == 0x7b) {
          bVar17 = local_218[1];
          if (bVar17 - 0x3a < 0xfffffff6) {
            if (local_210->is_utf16 != 0) {
LAB_00170201:
              pcVar25 = "invalid repetition count";
              goto LAB_001701c8;
            }
          }
          else {
            pbVar15 = local_218 + 1;
            uVar28 = 0;
            if (0xf5 < (byte)(bVar17 - 0x3a)) {
              uVar28 = 0;
              do {
                uVar28 = ((ulong)bVar17 + uVar28 * 10) - 0x30;
                if (0x7ffffffe < uVar28) {
                  uVar28 = 0x7fffffff;
                }
                bVar17 = pbVar15[1];
                pbVar15 = pbVar15 + 1;
              } while (0xf5 < (byte)(bVar17 - 0x3a));
            }
            iVar6 = (int)uVar28;
            iVar32 = iVar6;
            if (bVar17 == 0x2c) {
              local_218 = pbVar15 + 1;
              bVar17 = pbVar15[1];
              pbVar15 = local_218;
              iVar32 = 0x7fffffff;
              if (0xfffffff5 < bVar17 - 0x3a) {
                uVar28 = 0;
                if (0xf5 < (byte)(bVar17 - 0x3a)) {
                  uVar28 = 0;
                  do {
                    uVar28 = ((ulong)bVar17 + uVar28 * 10) - 0x30;
                    if (0x7ffffffe < uVar28) {
                      uVar28 = 0x7fffffff;
                    }
                    bVar17 = local_218[1];
                    local_218 = local_218 + 1;
                  } while (0xf5 < (byte)(bVar17 - 0x3a));
                }
                if ((int)uVar28 < iVar6) goto LAB_00170201;
                bVar17 = *local_218;
                pbVar15 = local_218;
                iVar32 = (int)uVar28;
              }
            }
            if (bVar17 == 0x7d) {
              local_218 = pbVar15 + 1;
              goto LAB_0016f693;
            }
            if (local_210->is_utf16 != 0) {
              uVar16 = 0x7d;
LAB_00170261:
              re_parse_error(s,"expecting \'%c\'",uVar16);
              return -1;
            }
          }
        }
        goto LAB_0016fe9e;
      }
      local_218 = local_218 + 1;
      iVar6 = 0;
      iVar32 = 1;
    }
LAB_0016f693:
    pbVar26 = local_218;
    uVar28 = uVar27 & 0xffffffff;
    if (*local_218 == 0x3f) {
      pbVar26 = local_218 + 1;
      iVar30 = (int)(local_210->byte_code).size - iVar7;
      uVar20 = 0;
      uVar12 = 0;
      local_218 = pbVar26;
      goto LAB_0016fa98;
    }
    iVar23 = (local_210->byte_code).error;
    if (iVar32 == 0) {
switchD_0016f710_caseD_7:
      if (iVar23 != 0) goto LAB_001701af;
      iVar30 = (int)(local_210->byte_code).size - iVar7;
      puVar19 = (local_210->byte_code).buf + uVar28;
      local_1f0 = uVar27;
      local_1e8 = uVar28;
      memset(local_158,0,0xff);
      uVar27 = local_1f0;
      uVar28 = local_1e8;
      if (0 < iVar30) {
        iVar23 = 0;
        iVar7 = -2;
        bVar13 = true;
LAB_0016f7e2:
        do {
          uVar9 = (uint)reopcode_info[puVar19[iVar23]].size;
          switch(puVar19[iVar23]) {
          case '\x01':
          case '\x02':
          case '\x03':
          case '\x04':
            goto switchD_0016f80b_caseD_1;
          case '\x05':
          case '\x06':
          case '\x0f':
          case '\x10':
          case '\x11':
          case '\x12':
          case '\x19':
          case '\x1b':
            break;
          default:
            if (iVar7 == -2) {
              iVar7 = 0;
            }
            break;
          case '\v':
          case '\f':
            pbVar31 = (byte *)((long)&local_158[0].len + (ulong)puVar19[(long)iVar23 + 1]);
            *pbVar31 = *pbVar31 | 1;
            break;
          case '\r':
            uVar12 = (ulong)puVar19[(long)iVar23 + 1];
            bVar17 = puVar19[(long)iVar23 + 2];
            if (puVar19[(long)iVar23 + 1] < bVar17) {
              do {
                pbVar31 = (byte *)((long)&local_158[0].len + uVar12);
                *pbVar31 = *pbVar31 | 1;
                uVar12 = uVar12 + 1;
              } while (bVar17 != uVar12);
            }
            break;
          case '\x13':
          case '\x14':
            goto switchD_0016f80b_caseD_13;
          case '\x15':
            sVar10 = 2;
            goto LAB_0016f84c;
          case '\x16':
            sVar10 = 3;
LAB_0016f84c:
            uVar9 = uVar9 + ((uint)*(ushort *)(puVar19 + (long)iVar23 + 1) << sVar10);
switchD_0016f80b_caseD_1:
            if (iVar7 == -2) {
              iVar7 = 1;
            }
          }
          iVar23 = iVar23 + uVar9;
        } while (iVar23 < iVar30);
        if (bVar13) goto LAB_0016f8bf;
        goto LAB_0016f8a3;
      }
      uVar12 = 1;
      goto LAB_0016fa95;
    }
    if (iVar23 == 0) {
      iVar30 = (int)(local_210->byte_code).size - iVar7;
      if (iVar30 < 1) {
        uVar12 = 1;
        goto LAB_0016fa95;
      }
      puVar19 = (local_210->byte_code).buf;
      iVar18 = 0;
      iVar22 = 0;
      do {
        bVar17 = puVar19[(long)iVar22 + uVar28];
        if (0x15 < bVar17 - 1) goto switchD_0016f710_caseD_7;
        uVar9 = (uint)reopcode_info[bVar17].size;
        switch((uint)bVar17) {
        case 1:
        case 2:
        case 3:
        case 4:
          goto switchD_0016f710_caseD_1;
        case 5:
        case 6:
        case 0x11:
        case 0x12:
          goto switchD_0016f710_caseD_5;
        default:
          goto switchD_0016f710_caseD_7;
        case 0x15:
          sVar10 = 2;
          break;
        case 0x16:
          sVar10 = 3;
        }
        uVar9 = (uint)reopcode_info[bVar17].size +
                ((uint)*(ushort *)(puVar19 + (long)iVar22 + uVar28 + 1) << sVar10);
switchD_0016f710_caseD_1:
        iVar18 = iVar18 + 1;
switchD_0016f710_caseD_5:
        iVar22 = iVar22 + uVar9;
      } while (iVar22 < iVar30);
      if (iVar18 < 1) goto switchD_0016f710_caseD_7;
      local_1e8 = uVar28;
      dbuf_putc(&local_210->byte_code,'\n');
      iVar30 = dbuf_insert(&s->byte_code,iVar7,0x11);
      if (iVar30 == 0) {
        (s->byte_code).buf[local_1e8] = '\x1c';
        puVar19 = (s->byte_code).buf;
        *(int *)(puVar19 + local_1e8 + 1) = ((int)(s->byte_code).size - iVar7) + -0x11;
        *(int *)(puVar19 + local_1e8 + 5) = iVar6;
        *(int *)(puVar19 + local_1e8 + 9) = iVar32;
        *(int *)(puVar19 + local_1e8 + 0xd) = iVar18;
        puVar19 = local_200;
        pbVar31 = local_218;
        goto LAB_0016fe9e;
      }
    }
    goto LAB_001701af;
  }
  goto LAB_0016fe9e;
switchD_0016f80b_caseD_13:
  pbVar31 = (byte *)((long)&local_158[0].len + (ulong)puVar19[(long)iVar23 + 1]);
  *pbVar31 = *pbVar31 | 2;
  iVar23 = iVar23 + uVar9;
  bVar13 = false;
  if (iVar30 <= iVar23) goto LAB_0016f8a3;
  goto LAB_0016f7e2;
LAB_0016f8a3:
  lVar11 = 0;
  do {
    if (*(char *)((long)&local_158[0].len + lVar11) == '\x03') {
      uVar12 = 0;
      goto LAB_0016fa95;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0xff);
LAB_0016f8bf:
  uVar12 = (ulong)((iVar7 + 2U & 0xfffffffd) == 0);
LAB_0016fa95:
  uVar20 = CONCAT71((int7)((ulong)puVar19 >> 8),1);
LAB_0016fa98:
  iVar7 = (int)uVar12;
  if (iVar6 == 0) {
    if ((int)local_1f8 != s->capture_count) {
      local_1e8 = CONCAT44(local_1e8._4_4_,(int)uVar20);
      local_1f0 = uVar27;
      iVar6 = dbuf_insert(&s->byte_code,(int)uVar27,3);
      uVar20 = local_1e8 & 0xffffffff;
      if (iVar6 != 0) goto LAB_001701af;
      (s->byte_code).buf[uVar28] = '\r';
      (s->byte_code).buf[uVar28 + 1] = (uint8_t)local_1f8;
      uVar27 = (ulong)((int)local_1f0 + 3);
      (s->byte_code).buf[uVar28 + 2] = (char)s->capture_count + 0xff;
    }
    uVar5 = (uint32_t)uVar27;
    bVar17 = (byte)uVar20;
    if (iVar32 != 0x7fffffff) {
      if (iVar32 == 1) {
        iVar7 = dbuf_insert(&s->byte_code,uVar5,5);
        if (iVar7 != 0) goto LAB_001701af;
        (s->byte_code).buf[uVar27 & 0xffffffff] = bVar17 | 8;
        *(int *)((s->byte_code).buf + (uVar27 & 0xffffffff) + 1) = iVar30;
        puVar19 = local_200;
        pbVar31 = local_218;
        goto LAB_0016fe9e;
      }
      if (iVar32 == 0) {
        (s->byte_code).size = uVar27 & 0xffffffff;
        puVar19 = local_200;
        pbVar31 = local_218;
        goto LAB_0016fe9e;
      }
      iVar7 = dbuf_insert(&s->byte_code,uVar5,10);
      if (iVar7 != 0) goto LAB_001701af;
      (s->byte_code).buf[uVar27 & 0xffffffff] = '\x0f';
      puVar19 = (s->byte_code).buf;
      *(int *)(puVar19 + (long)(int)uVar5 + 1) = iVar32;
      puVar19[(long)(int)uVar5 + 5] = bVar17 | 8;
      *(int *)((s->byte_code).buf + (long)(int)uVar5 + 6) = iVar30 + 5;
      dbuf_putc(&s->byte_code,'\x0e');
      local_158[0].len = (uVar5 - (int)(s->byte_code).size) + 1;
LAB_0016fe45:
      dbuf_put(&s->byte_code,(uint8_t *)local_158,4);
      dbuf_putc(&s->byte_code,'\x10');
      puVar19 = local_200;
      pbVar31 = local_218;
      goto LAB_0016fe9e;
    }
    iVar6 = dbuf_insert(&s->byte_code,uVar5,iVar7 + 5);
    if (iVar6 != 0) {
LAB_001701af:
      pcVar25 = "out of memory";
LAB_001701c8:
      re_parse_error(s,pcVar25);
      return -1;
    }
    (s->byte_code).buf[uVar27 & 0xffffffff] = bVar17 | 8;
    puVar19 = (s->byte_code).buf;
    *(int *)(puVar19 + (uVar27 & 0xffffffff) + 1) = iVar30 + iVar7 + 5;
    if (iVar7 == 0) {
      re_emit_goto(s,7,uVar5);
      puVar19 = local_200;
      pbVar31 = local_218;
      goto LAB_0016fe9e;
    }
    puVar19[(long)(int)uVar5 + 5] = '\x19';
    bVar17 = 0x1a;
LAB_0016faca:
    dbuf_putc(&s->byte_code,bVar17);
    local_158[0].len = ((int)uVar27 - (int)(s->byte_code).size) + -4;
  }
  else {
    if (((iVar6 == 1) && (iVar32 == 0x7fffffff)) && (iVar7 == 0)) {
      bVar17 = (byte)uVar20 ^ 9;
      goto LAB_0016faca;
    }
    local_1a0 = uVar12;
    if (iVar6 != 1) {
      local_1e8 = CONCAT44(local_1e8._4_4_,(int)uVar20);
      local_1f0 = uVar27;
      iVar7 = dbuf_insert(&s->byte_code,(int)uVar27,5);
      if (iVar7 != 0) goto LAB_001701af;
      (s->byte_code).buf[uVar28] = '\x0f';
      *(int *)((s->byte_code).buf + uVar28 + 1) = iVar6;
      iVar7 = (int)local_1f0;
      local_1f8 = CONCAT44(local_1f8._4_4_,iVar7 + 5);
      dbuf_putc(&s->byte_code,'\x0e');
      local_158[0].len = (iVar7 - (int)(s->byte_code).size) + 1;
      uVar20 = local_1e8 & 0xffffffff;
      dbuf_put(&s->byte_code,(uint8_t *)local_158,4);
      dbuf_putc(&s->byte_code,'\x10');
      uVar27 = local_1f8 & 0xffffffff;
    }
    if (iVar32 != 0x7fffffff) {
      puVar19 = local_200;
      pbVar31 = local_218;
      if (iVar32 - iVar6 == 0 || iVar32 < iVar6) goto LAB_0016fe9e;
      local_1f0 = uVar27;
      dbuf_putc(&s->byte_code,'\x0f');
      local_158[0].len = iVar32 - iVar6;
      dbuf_put(&s->byte_code,(uint8_t *)local_158,4);
      sVar14 = (s->byte_code).size;
      dbuf_putc(&s->byte_code,(byte)uVar20 | 8);
      local_158[0].len = iVar30 + 5;
      dbuf_put(&s->byte_code,(uint8_t *)local_158,4);
      dbuf_put_self(&s->byte_code,local_1f0 & 0xffffffff,(long)iVar30);
      dbuf_putc(&s->byte_code,'\x0e');
      local_158[0].len = ((int)sVar14 - (int)(s->byte_code).size) + -4;
      goto LAB_0016fe45;
    }
    sVar14 = (s->byte_code).size;
    iVar7 = (int)local_1a0;
    dbuf_putc(&s->byte_code,(byte)uVar20 | 8);
    local_158[0].len = iVar30 + iVar7 + 5;
    dbuf_put(&s->byte_code,(uint8_t *)local_158,4);
    if ((int)local_1a0 == 0) {
      dbuf_put_self(&s->byte_code,uVar27 & 0xffffffff,(long)iVar30);
      uVar21 = '\a';
    }
    else {
      dbuf_putc(&s->byte_code,'\x19');
      dbuf_put_self(&s->byte_code,uVar27 & 0xffffffff,(long)iVar30);
      uVar21 = '\x1a';
    }
    dbuf_putc(&s->byte_code,uVar21);
    local_158[0].len = ((int)sVar14 - (int)(s->byte_code).size) + -4;
  }
  dbuf_put(&s->byte_code,(uint8_t *)local_158,4);
  puVar19 = local_200;
  pbVar31 = local_218;
LAB_0016fe9e:
  local_218 = pbVar31;
  s->buf_ptr = pbVar26;
  if ((int)puVar19 != 0) {
    sVar14 = (s->byte_code).size;
    sVar29 = sVar14 - local_1e0;
    iVar7 = dbuf_realloc(&s->byte_code,sVar14 + sVar29);
    sVar2 = local_180;
    if (iVar7 != 0) {
      return -1;
    }
    puVar24 = (s->byte_code).buf + local_180;
    memmove(puVar24 + sVar29,puVar24,sVar14 - local_180);
    puVar24 = (s->byte_code).buf;
    memcpy(puVar24 + sVar2,puVar24 + sVar14,sVar29);
    pbVar26 = s->buf_ptr;
  }
  if (s->buf_end <= pbVar26) {
    return 0;
  }
  goto LAB_0016ee8b;
}

Assistant:

static int re_parse_alternative(REParseState *s, BOOL is_backward_dir)
{
    const uint8_t *p;
    int ret;
    size_t start, term_start, end, term_size;

    start = s->byte_code.size;
    for(;;) {
        p = s->buf_ptr;
        if (p >= s->buf_end)
            break;
        if (*p == '|' || *p == ')')
            break;
        term_start = s->byte_code.size;
        ret = re_parse_term(s, is_backward_dir);
        if (ret)
            return ret;
        if (is_backward_dir) {
            /* reverse the order of the terms (XXX: inefficient, but
               speed is not really critical here) */
            end = s->byte_code.size;
            term_size = end - term_start;
            if (dbuf_realloc(&s->byte_code, end + term_size))
                return -1;
            memmove(s->byte_code.buf + start + term_size,
                    s->byte_code.buf + start,
                    end - start);
            memcpy(s->byte_code.buf + start, s->byte_code.buf + end,
                   term_size);
        }
    }
    return 0;
}